

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadEventType(BinaryReader *this,Index *out_sig_index)

{
  bool bVar1;
  Result RVar2;
  uint32_t local_24;
  Index *pIStack_20;
  uint32_t attribute;
  Index *out_sig_index_local;
  BinaryReader *this_local;
  
  pIStack_20 = out_sig_index;
  out_sig_index_local = (Index *)this;
  RVar2 = ReadU32Leb128(this,&local_24,"event attribute");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_24 == 0) {
    RVar2 = ReadIndex(this,pIStack_20,"event signature index");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    PrintError(this,"event attribute must be 0");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadEventType(Index* out_sig_index) {
  uint32_t attribute;
  CHECK_RESULT(ReadU32Leb128(&attribute, "event attribute"));
  ERROR_UNLESS(attribute == 0, "event attribute must be 0");
  CHECK_RESULT(ReadIndex(out_sig_index, "event signature index"));
  return Result::Ok;
}